

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::_::TransformPromiseNodeBase::get(TransformPromiseNodeBase *this,ExceptionOrValue *output)

{
  NullableValue<kj::Exception> _exception2474;
  NullableValue<kj::Exception> local_340;
  NullableValue<kj::Exception> local_1a8;
  
  (*(this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember[5])();
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&this->dependency);
  local_1a8.isSet = false;
  NullableValue<kj::Exception>::NullableValue(&local_340,&local_1a8);
  NullableValue<kj::Exception>::~NullableValue(&local_1a8);
  if (local_340.isSet == true) {
    ExceptionOrValue::addException(output,&local_340.field_1.value);
  }
  NullableValue<kj::Exception>::~NullableValue(&local_340);
  return;
}

Assistant:

void TransformPromiseNodeBase::get(ExceptionOrValue& output) noexcept {
  KJ_IF_SOME(exception, kj::runCatchingExceptions([&]() {
    getImpl(output);
    dropDependency();
  })) {
    output.addException(kj::mv(exception));
  }
}